

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerator::InfoT::GetString(InfoT *this,string *key,string *value,bool required)

{
  bool bVar1;
  ulong uVar2;
  string local_c8;
  string_view local_a8;
  String local_98;
  string local_68;
  string_view local_48;
  Value *local_38;
  Value *jval;
  string *psStack_28;
  bool required_local;
  string *value_local;
  string *key_local;
  InfoT *this_local;
  
  jval._7_1_ = required;
  psStack_28 = value;
  value_local = key;
  key_local = (string *)this;
  local_38 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isString(local_38);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&local_98,local_38);
    std::__cxx11::string::operator=((string *)psStack_28,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) != 0) && ((jval._7_1_ & 1) != 0)) {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[11]>
                (&local_c8,value_local,(char (*) [11])0xff1c14);
      local_a8 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
      this_local._7_1_ = LogError(this,local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      goto LAB_009ad25a;
    }
  }
  else {
    bVar1 = Json::Value::isNull(local_38);
    if ((!bVar1) || ((jval._7_1_ & 1) != 0)) {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[18]>
                (&local_68,value_local,(char (*) [18])0xff1bc8);
      local_48 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
      this_local._7_1_ = LogError(this,local_48);
      std::__cxx11::string::~string((string *)&local_68);
      goto LAB_009ad25a;
    }
  }
  this_local._7_1_ = 1;
LAB_009ad25a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetString(std::string const& key,
                                         std::string& value,
                                         bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (!jval.isString()) {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not a string."));
    }
  } else {
    value = jval.asString();
    if (value.empty() && required) {
      return this->LogError(cmStrCat(key, " is empty."));
    }
  }
  return true;
}